

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::
getNumGeneratedElementsPerPrimitive(FeedbackPrimitiveTypeCase *this)

{
  int iVar1;
  
  iVar1 = -1;
  if (this->m_geometryOutputType < GEOMETRY_OUTPUT_LAST) {
    iVar1 = this->m_geometryOutputType + GEOMETRY_OUTPUT_LINES;
  }
  return iVar1;
}

Assistant:

int FeedbackPrimitiveTypeCase::getNumGeneratedElementsPerPrimitive (void) const
{
	if (m_geometryOutputType == GEOMETRY_OUTPUT_TRIANGLES)
		return 3;
	else if (m_geometryOutputType == GEOMETRY_OUTPUT_LINES)
		return 2;
	else if (m_geometryOutputType == GEOMETRY_OUTPUT_POINTS)
		return 1;
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}